

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O3

Amount cfd::core::operator*(int64_t value,Amount *amount)

{
  long lVar1;
  Amount AVar2;
  
  lVar1 = amount->amount_;
  Amount::CheckValidAmount(0x337c4b);
  Amount::CheckValidAmount(0x337c53);
  Amount::CheckValidAmount(0x337c5f);
  AVar2._8_8_ = 0;
  AVar2.amount_ = value * lVar1;
  return AVar2;
}

Assistant:

Amount operator*(const int64_t value, const Amount& amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) *= value;
}